

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::AddRawTransactionRequest::AddRawTransactionRequest
          (AddRawTransactionRequest *this)

{
  allocator local_11;
  AddRawTransactionRequest *local_10;
  AddRawTransactionRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::AddRawTransactionRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::AddRawTransactionRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::AddRawTransactionRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__AddRawTransactionRequest_01b3aa00;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->tx_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  core::JsonObjectVector<cfd::js::api::json::TxInRequest,_cfd::js::api::TxInRequestStruct>::
  JsonObjectVector(&this->txins_);
  core::JsonObjectVector<cfd::js::api::json::TxOutRequest,_cfd::js::api::TxOutRequestStruct>::
  JsonObjectVector(&this->txouts_);
  CollectFieldName();
  return;
}

Assistant:

AddRawTransactionRequest() {
    CollectFieldName();
  }